

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void xm_create_context_from_libxmize(xm_context_t **ctxp,char *libxmized,uint32_t rate)

{
  int8_t *piVar1;
  size_t k_1;
  size_t k;
  size_t j;
  size_t i;
  uint32_t rate_local;
  char *libxmized_local;
  xm_context_t **ctxp_local;
  
  *ctxp = (xm_context_t *)libxmized;
  ((*ctxp)->module).patterns =
       (xm_pattern_t *)
       (((*ctxp)->module).pattern_table + (long)&(((*ctxp)->module).patterns + -1)[-1].slots);
  ((*ctxp)->module).instruments =
       (xm_instrument_t *)
       (((*ctxp)->module).pattern_table +
       (long)((((*ctxp)->module).instruments)->sample_of_notes + -10) + -0x10);
  (*ctxp)->row_loop_count = (*ctxp)->row_loop_count + (long)*ctxp;
  (*ctxp)->channels =
       (xm_channel_context_t *)
       (((*ctxp)->module).pattern_table + (long)((*ctxp)->channels[-1].actual_volume + -4));
  for (i = 0; i < ((*ctxp)->module).num_patterns; i = i + 1) {
    ((*ctxp)->module).patterns[i].slots =
         (xm_pattern_slot_t *)
         (((*ctxp)->module).pattern_table +
         (long)&(((*ctxp)->module).patterns[i].slots + -2)[-3].instrument);
  }
  for (i = 0; i < ((*ctxp)->module).num_instruments; i = i + 1) {
    ((*ctxp)->module).instruments[i].samples =
         (xm_sample_t *)
         (((*ctxp)->module).pattern_table +
         (long)&((*ctxp)->module).instruments[i].samples[-1].panning);
    for (j = 0; j < ((*ctxp)->module).instruments[i].num_samples; j = j + 1) {
      ((*ctxp)->module).instruments[i].samples[j].field_11.data8 =
           ((*ctxp)->module).instruments[i].samples[j].field_11.data8 + (long)*ctxp;
      if (1 < ((*ctxp)->module).instruments[i].samples[j].length) {
        if (((*ctxp)->module).instruments[i].samples[j].bits == '\b') {
          for (k = 1; k < ((*ctxp)->module).instruments[i].samples[j].length; k = k + 1) {
            piVar1 = ((*ctxp)->module).instruments[i].samples[j].field_11.data8;
            piVar1[k] = piVar1[k] +
                        ((*ctxp)->module).instruments[i].samples[j].field_11.data8[k - 1];
          }
        }
        else {
          for (k_1 = 1; k_1 < ((*ctxp)->module).instruments[i].samples[j].length; k_1 = k_1 + 1) {
            piVar1 = ((*ctxp)->module).instruments[i].samples[j].field_11.data8;
            *(short *)(piVar1 + k_1 * 2) =
                 *(short *)(piVar1 + k_1 * 2) +
                 *(short *)(((*ctxp)->module).instruments[i].samples[j].field_11.data8 +
                           (k_1 - 1) * 2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void xm_create_context_from_libxmize(xm_context_t** ctxp, char* libxmized, uint32_t rate) {
	size_t i, j;

	*ctxp = (void*)libxmized;

	/* Reverse steps of libxmize.c */
	OFFSET((*ctxp)->module.patterns);
	OFFSET((*ctxp)->module.instruments);
	OFFSET((*ctxp)->row_loop_count);
	OFFSET((*ctxp)->channels);

	for(i = 0; i < (*ctxp)->module.num_patterns; ++i) {
		OFFSET((*ctxp)->module.patterns[i].slots);
	}

	for(i = 0; i < (*ctxp)->module.num_instruments; ++i) {
		OFFSET((*ctxp)->module.instruments[i].samples);

		for(j = 0; j < (*ctxp)->module.instruments[i].num_samples; ++j) {
			OFFSET((*ctxp)->module.instruments[i].samples[j].data8);

			if(XM_LIBXMIZE_DELTA_SAMPLES) {
				if((*ctxp)->module.instruments[i].samples[j].length > 1) {
					if((*ctxp)->module.instruments[i].samples[j].bits == 8) {
						for(size_t k = 1; k < (*ctxp)->module.instruments[i].samples[j].length; ++k) {
							(*ctxp)->module.instruments[i].samples[j].data8[k] += (*ctxp)->module.instruments[i].samples[j].data8[k-1];
						}
					} else {
						for(size_t k = 1; k < (*ctxp)->module.instruments[i].samples[j].length; ++k) {
							(*ctxp)->module.instruments[i].samples[j].data16[k] += (*ctxp)->module.instruments[i].samples[j].data16[k-1];
						}
					}
				}
			}
		}
	}
}